

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

void nullcSetEnableTimeTrace(int enable)

{
  int enable_local;
  
  NULLC::traceContext = NULLC::TraceGetContext();
  NULLC::TraceSetEnabled(enable != 0);
  return;
}

Assistant:

void nullcSetEnableTimeTrace(int enable)
{
	NULLC::traceContext = NULLC::TraceGetContext();
	NULLC::TraceSetEnabled(enable != 0);
}